

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# name.cpp
# Opt level: O2

NameBlock * __thiscall FName::NameManager::AddBlock(NameManager *this,size_t len)

{
  NameBlock *pNVar1;
  size_t size;
  
  size = 0x1000;
  if (0x1000 < len + 0x10) {
    size = len + 0x10;
  }
  pNVar1 = (NameBlock *)
           M_Malloc_Dbg(size,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/name.cpp"
                        ,0xfd);
  pNVar1->NextAlloc = 0x10;
  pNVar1->NextBlock = this->Blocks;
  this->Blocks = pNVar1;
  return pNVar1;
}

Assistant:

FName::NameManager::NameBlock *FName::NameManager::AddBlock (size_t len)
{
	NameBlock *block;

	len += sizeof(NameBlock);
	if (len < BLOCK_SIZE)
	{
		len = BLOCK_SIZE;
	}
	block = (NameBlock *)M_Malloc (len);
	block->NextAlloc = sizeof(NameBlock);
	block->NextBlock = Blocks;
	Blocks = block;
	return block;
}